

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_reader.cpp
# Opt level: O1

bool __thiscall
HawkTracer::parser::ProtocolReader::_read_numeric
          (ProtocolReader *this,FieldType *value,EventKlassField *field)

{
  Stream *pSVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  ulong uVar5;
  ushort uVar6;
  uint uVar7;
  HT_Endianness HVar8;
  ulong uVar9;
  char buff [16];
  uint8_t local_38;
  byte bStack_37;
  undefined2 uStack_36;
  undefined4 uStack_34;
  
  pSVar1 = (this->_stream)._M_t.
           super___uniq_ptr_impl<HawkTracer::parser::Stream,_std::default_delete<HawkTracer::parser::Stream>_>
           ._M_t.
           super__Tuple_impl<0UL,_HawkTracer::parser::Stream_*,_std::default_delete<HawkTracer::parser::Stream>_>
           .super__Head_base<0UL,_HawkTracer::parser::Stream_*,_false>._M_head_impl;
  sVar4 = EventKlassField::get_sizeof(field);
  iVar2 = (*pSVar1->_vptr_Stream[3])(pSVar1,&local_38,sVar4);
  if ((char)iVar2 == '\0') {
LAB_00111090:
    return false;
  }
  switch(field->_type_id) {
  case UINT8:
  case INT8:
    value->f_UINT8 = local_38;
    return true;
  case UINT16:
    HVar8 = this->_endianness;
    if ((is_system_endianness(HT_Endianness)::sys_endianness != '\0') ||
       (iVar2 = __cxa_guard_acquire(&is_system_endianness(HT_Endianness)::sys_endianness),
       iVar2 == 0)) goto LAB_00110fdf;
    is_system_endianness(HT_Endianness)::sys_endianness = ht_system_info_get_endianness();
    break;
  case INT16:
    HVar8 = this->_endianness;
    if ((is_system_endianness(HT_Endianness)::sys_endianness != '\0') ||
       (iVar2 = __cxa_guard_acquire(&is_system_endianness(HT_Endianness)::sys_endianness),
       iVar2 == 0)) goto LAB_00110fdf;
    is_system_endianness(HT_Endianness)::sys_endianness = ht_system_info_get_endianness();
    break;
  case UINT32:
    uVar7 = CONCAT22(uStack_36,CONCAT11(bStack_37,local_38));
    HVar8 = this->_endianness;
    if ((is_system_endianness(HT_Endianness)::sys_endianness != '\0') ||
       (iVar2 = __cxa_guard_acquire(&is_system_endianness(HT_Endianness)::sys_endianness),
       iVar2 == 0)) goto LAB_00111047;
    is_system_endianness(HT_Endianness)::sys_endianness = ht_system_info_get_endianness();
    goto LAB_001110e9;
  case INT32:
    uVar7 = CONCAT22(uStack_36,CONCAT11(bStack_37,local_38));
    HVar8 = this->_endianness;
    if ((is_system_endianness(HT_Endianness)::sys_endianness != '\0') ||
       (iVar2 = __cxa_guard_acquire(&is_system_endianness(HT_Endianness)::sys_endianness),
       iVar2 == 0)) goto LAB_00111047;
    is_system_endianness(HT_Endianness)::sys_endianness = ht_system_info_get_endianness();
LAB_001110e9:
    __cxa_guard_release(&is_system_endianness(HT_Endianness)::sys_endianness);
LAB_00111047:
    uVar3 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
    if (is_system_endianness(HT_Endianness)::sys_endianness == HVar8) {
      uVar3 = uVar7;
    }
    value->f_UINT32 = uVar3;
    return true;
  case UINT64:
    uVar9 = CONCAT44(uStack_34,CONCAT22(uStack_36,CONCAT11(bStack_37,local_38)));
    HVar8 = this->_endianness;
    if ((is_system_endianness(HT_Endianness)::sys_endianness != '\0') ||
       (iVar2 = __cxa_guard_acquire(&is_system_endianness(HT_Endianness)::sys_endianness),
       iVar2 == 0)) goto LAB_00111078;
    is_system_endianness(HT_Endianness)::sys_endianness = ht_system_info_get_endianness();
    goto LAB_0011111c;
  case INT64:
    uVar9 = CONCAT44(uStack_34,CONCAT22(uStack_36,CONCAT11(bStack_37,local_38)));
    HVar8 = this->_endianness;
    if ((is_system_endianness(HT_Endianness)::sys_endianness != '\0') ||
       (iVar2 = __cxa_guard_acquire(&is_system_endianness(HT_Endianness)::sys_endianness),
       iVar2 == 0)) goto LAB_00111078;
    is_system_endianness(HT_Endianness)::sys_endianness = ht_system_info_get_endianness();
LAB_0011111c:
    __cxa_guard_release(&is_system_endianness(HT_Endianness)::sys_endianness);
LAB_00111078:
    uVar5 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18 |
            (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
            (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
    if (is_system_endianness(HT_Endianness)::sys_endianness == HVar8) {
      uVar5 = uVar9;
    }
    value->f_UINT64 = uVar5;
    return true;
  case POINTER:
    goto LAB_00111090;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/parser/protocol_reader.cpp"
                  ,0xd0,
                  "bool HawkTracer::parser::ProtocolReader::_read_numeric(FieldType &, const EventKlassField &)"
                 );
  }
  __cxa_guard_release(&is_system_endianness(HT_Endianness)::sys_endianness);
LAB_00110fdf:
  uVar6 = CONCAT11(bStack_37,local_38) << 8 | (ushort)bStack_37;
  if (is_system_endianness(HT_Endianness)::sys_endianness == HVar8) {
    uVar6 = CONCAT11(bStack_37,local_38);
  }
  value->f_UINT16 = uVar6;
  return true;
}

Assistant:

bool ProtocolReader::_read_numeric(FieldType& value, const EventKlassField& field)
{
    char buff[16];
    if (!_stream->read_data(buff, field.get_sizeof()))
    {
        return false;
    }

    switch (field.get_type_id())
    {
#define SET_VALUE(field_id, c_type) case FieldTypeId::field_id: value.f_##field_id = convert_endianness_to_native(*((c_type*)buff), _endianness); break
    SET_VALUE(UINT8, uint8_t);
    SET_VALUE(INT8, int8_t);
    SET_VALUE(UINT16, uint16_t);
    SET_VALUE(INT16, int16_t);
    SET_VALUE(UINT32, uint32_t);
    SET_VALUE(INT32, int32_t);
    SET_VALUE(UINT64, uint64_t);
    SET_VALUE(INT64, int64_t);
#undef SET_VALUE
    case FieldTypeId::POINTER:
        return false;
        break;
    default: assert(0); return false;
    }

    return true;
}